

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.hpp
# Opt level: O0

void __thiscall
sp::template_classifier::create_templates(template_classifier *this,string *g_loc,string *b_loc)

{
  vector<cv::Mat,_std::allocator<cv::Mat>_> *in_RDI;
  container_t ret;
  string *in_stack_00000160;
  template_classifier *in_stack_00000168;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *in_stack_ffffffffffffff90;
  
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)0x103390);
  make_templates_(in_stack_00000168,in_stack_00000160);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator=(in_stack_ffffffffffffff90,in_RDI);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(in_stack_ffffffffffffff90);
  make_templates_(in_stack_00000168,in_stack_00000160);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator=(in_stack_ffffffffffffff90,in_RDI);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(in_stack_ffffffffffffff90);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(in_stack_ffffffffffffff90);
  return;
}

Assistant:

inline void create_templates(const std::string& g_loc, const std::string& b_loc)
	{
		container_t ret;
		good_templates = make_templates_(g_loc);
		bad_templates  = make_templates_(b_loc);
	}